

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2db.cpp
# Opt level: O3

Am_Object example2db_Initialize(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  ushort uVar3;
  Am_Wrapper *pAVar4;
  Am_Object AVar5;
  Am_Object *pAVar6;
  ulong uVar7;
  Am_Constraint *pAVar8;
  undefined8 uVar9;
  Am_Value_List *this;
  Am_Object_Data *in_RDI;
  Am_Object AStack_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Font local_80 [8];
  Am_Object local_78;
  Am_Object local_70;
  Am_Font local_68 [8];
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Value_List local_38 [16];
  
  Am_Object::Create((char *)&local_40);
  uVar2 = Am_Object::Set((ushort)&local_40,(Am_Method_Wrapper *)0x89,
                         _Am_Default_Pop_Up_Window_Destroy_Method);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Green);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar2 = Am_Object::Set(uVar2,(char *)0x6c,0x1061b5);
  uVar2 = Am_Object::Set(uVar2,(char *)0x6d,0x1061b5);
  uVar2 = Am_Object::Set(uVar2,0x66,0x1b6);
  AVar5.data = (Am_Object_Data *)Am_Object::Set(uVar2,0x67,0x97);
  Am_Object::Create((char *)&local_50);
  uVar2 = Am_Object::Set((ushort)&local_50,100,0xc);
  uVar2 = Am_Object::Set(uVar2,0x65,7);
  uVar2 = Am_Object::Set(uVar2,0x66,0x1aa);
  uVar2 = Am_Object::Set(uVar2,0x67,0x3b);
  uVar2 = Am_Object::Set(uVar2,0x172,0);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Green);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::Am_Object(&local_48,pAVar6);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_48,0),1);
  Am_Object::Create((char *)&local_60);
  uVar2 = Am_Object::Set((ushort)&local_60,100,0xe);
  uVar2 = Am_Object::Set(uVar2,0x65,0x11);
  uVar2 = Am_Object::Set(uVar2,0x66,0x197);
  uVar2 = Am_Object::Set(uVar2,0x67,0x12);
  uVar2 = Am_Object::Set(uVar2,(char *)0xab,0x1061cd);
  Am_Font::Am_Font(local_68,Am_FONT_FIXED,false,true,false,Am_FONT_LARGE);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(local_68);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar4);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar4);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::Am_Object(&local_58,pAVar6);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_58,0),1);
  Am_Object::Create((char *)&local_78);
  uVar2 = Am_Object::Set((ushort)&local_78,100,0x67);
  uVar2 = Am_Object::Set(uVar2,0x65,0x28);
  uVar2 = Am_Object::Set(uVar2,0x66,0xf2);
  uVar2 = Am_Object::Set(uVar2,0x67,0x12);
  uVar2 = Am_Object::Set(uVar2,(char *)0xab,0x1061f3);
  Am_Font::Am_Font(local_80,Am_FONT_FIXED,false,true,false,Am_FONT_LARGE);
  pAVar4 = Am_Font::operator_cast_to_Am_Wrapper_(local_80);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xac,(ulong)pAVar4);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar4);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::Am_Object(&local_70,pAVar6);
  uVar2 = Am_Object::Add_Part(AVar5,SUB81(&local_70,0),1);
  AVar1 = GILT_DB_VALUE;
  Am_Object::Create((char *)&local_a0);
  uVar3 = Am_Object::Set((ushort)&local_a0,100,0x1e);
  uVar3 = Am_Object::Set(uVar3,0x65,0x4b);
  uVar3 = Am_Object::Set(uVar3,0x66,0x185);
  uVar7 = Am_Object::Set(uVar3,0x67,0x19);
  Am_Object::Get_Object((ushort)&local_98,uVar7);
  uVar7 = Am_Object::Set((ushort)&local_98,(char *)0x150,0x10620a);
  Am_Object::Get_Object((ushort)&local_90,uVar7);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Green);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)&local_90,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  Am_Object::Am_Object(&local_88,pAVar6);
  AVar5.data._2_6_ = 0;
  AVar5.data._0_2_ = AVar1;
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(uVar2,AVar5,(ulong)&local_88);
  Am_Object::Create((char *)&local_b0);
  uVar2 = Am_Object::Set((ushort)&local_b0,100,0xa2);
  uVar2 = Am_Object::Set(uVar2,0x65,0x71);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Green);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  pAVar8 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Horizontal_Layout);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x94,(ulong)pAVar8);
  uVar2 = Am_Object::Set(uVar2,0x95,0x28);
  uVar2 = Am_Object::Set(uVar2,0x96,0);
  uVar2 = Am_Object::Set(uVar2,0x9c,0);
  Am_Value_List::Am_Value_List(local_38);
  Am_Object::Create((char *)&local_b8);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_b8);
  uVar9 = Am_Value_List::Add(local_38,pAVar4,1,1);
  Am_Object::Create((char *)&local_c0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_c0);
  this = (Am_Value_List *)Am_Value_List::Add(uVar9,pAVar4,1,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(this);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xa2,(ulong)pAVar4);
  Am_Object::Am_Object(&local_a8,pAVar6);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_a8,0),1);
  Am_Object::Create((char *)&AStack_c8);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(AVar5,SUB81(&AStack_c8,0),1);
  Am_Object::operator=(&example2db,pAVar6);
  Am_Object::~Am_Object(&AStack_c8);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_b8);
  Am_Value_List::~Am_Value_List(local_38);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_70);
  Am_Font::~Am_Font(local_80);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_58);
  Am_Font::~Am_Font(local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object((Am_Object *)in_RDI,&example2db);
  return (Am_Object)in_RDI;
}

Assistant:

Am_Object example2db_Initialize () {
  example2db = Am_Window.Create("example2db")
    .Set(Am_DESTROY_WINDOW_METHOD, Am_Default_Pop_Up_Window_Destroy_Method)
    .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
    .Set(Am_TITLE, "Gilt-Created Dialog Box")
    .Set(Am_ICON_TITLE, "Gilt-Created Dialog Box")
    .Set(Am_WIDTH, 438)
    .Set(Am_HEIGHT, 151)
    .Add_Part(Am_Border_Rectangle.Create()
      .Set(Am_LEFT, 12)
      .Set(Am_TOP, 7)
      .Set(Am_WIDTH, 426)
      .Set(Am_HEIGHT, 59)
      .Set(Am_SELECTED, 0)
      .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
    )
    .Add_Part(Am_Text.Create()
      .Set(Am_LEFT, 14)
      .Set(Am_TOP, 17)
      .Set(Am_WIDTH, 407)
      .Set(Am_HEIGHT, 18)
      .Set(Am_TEXT, "This is a Dialog Box created with the")
      .Set(Am_FONT, Am_Font(Am_FONT_FIXED, false, true, false, Am_FONT_LARGE))
      .Set(Am_LINE_STYLE, Am_Black)
      .Set(Am_FILL_STYLE, Am_No_Style)
    )
    .Add_Part(Am_Text.Create()
      .Set(Am_LEFT, 103)
      .Set(Am_TOP, 40)
      .Set(Am_WIDTH, 242)
      .Set(Am_HEIGHT, 18)
      .Set(Am_TEXT, "Gilt Interface Builder")
      .Set(Am_FONT, Am_Font(Am_FONT_FIXED, false, true, false, Am_FONT_LARGE))
      .Set(Am_LINE_STYLE, Am_Black)
      .Set(Am_FILL_STYLE, Am_No_Style)
    )
    .Add_Part(GILT_DB_VALUE, Am_Text_Input_Widget.Create("GILT_DB_VALUE")
      .Set(Am_LEFT, 30)
      .Set(Am_TOP, 75)
      .Set(Am_WIDTH, 389)
      .Set(Am_HEIGHT, 25)
      .Get_Object(Am_COMMAND)
        .Set(Am_LABEL, "Value To Use:")
        .Get_Owner()
      .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
    )
    .Add_Part(Am_Button_Panel.Create()
      .Set(Am_LEFT, 162)
      .Set(Am_TOP, 113)
      .Set(Am_FILL_STYLE, Am_Motif_Light_Green)
      .Set(Am_LAYOUT, Am_Horizontal_Layout)
      .Set(Am_H_SPACING, 40)
      .Set(Am_V_SPACING, 0)
      .Set(Am_MAX_RANK, 0)
      .Set(Am_ITEMS, Am_Value_List()
        .Add(Am_Standard_OK_Command.Create())
        .Add(Am_Standard_Cancel_Command.Create())
        )
    )
    .Add_Part(Am_Tab_To_Next_Widget_Interactor.Create())
  ;
  return example2db;
}